

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

int nn_sws_recv(nn_pipebase *self,nn_msg *msg)

{
  byte bVar1;
  int iVar2;
  nn_chunkref *pnVar3;
  msg_chunk *it_00;
  size_t sVar4;
  void *pvVar5;
  undefined8 *puVar6;
  long in_RSI;
  long in_RDI;
  size_t pos;
  size_t cmsgsz;
  uint8_t opcode;
  uint8_t opcode_hdr;
  nn_cmsghdr *cmsg;
  msg_chunk *ch;
  nn_list_item *it;
  nn_sws *sws;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  nn_msg *in_stack_ffffffffffffff90;
  nn_list_item *local_60;
  undefined3 uVar7;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar8;
  nn_chunkref *pnVar9;
  long local_48;
  byte local_31;
  
  if (in_RDI == 0) {
    pnVar3 = (nn_chunkref *)0x0;
  }
  else {
    pnVar3 = (nn_chunkref *)(in_RDI + -0x1538);
  }
  if (*(int *)((long)&pnVar3[2].u + 0x18) != 4) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",
            (ulong)*(uint *)((long)&pnVar3[2].u + 0x18),"NN_SWS_STATE_ACTIVE",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
            ,0x1ec);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar8 = *(int *)&pnVar3[0xb1].u;
  pnVar9 = pnVar3;
  if (iVar8 == 4) {
    local_31 = pnVar3[0xb4].u.ref[0x1c];
    if (*(int *)((long)&pnVar3[0xb2].u + 8) == 0) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sws->is_final_frame",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x1f6);
      fflush(_stderr);
      nn_err_abort();
    }
    if ((local_31 & 0x80) == 0) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","opcode_hdr & NN_SWS_FRAME_BITMASK_FIN",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x1f7);
      fflush(_stderr);
      nn_err_abort();
    }
    uVar7 = (undefined3)in_stack_ffffffffffffffa8;
    in_stack_ffffffffffffffa8 = CONCAT13(1,uVar7);
    if ((local_31 & 0xf) != 2) {
      in_stack_ffffffffffffffa8 = CONCAT13((local_31 & 0xf) == 1,uVar7);
    }
    if ((((byte)((uint)in_stack_ffffffffffffffa8 >> 0x18) ^ 0xff) & 1) != 0) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
              "opcode == NN_WS_OPCODE_BINARY || opcode == NN_WS_OPCODE_TEXT",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x1fe);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_msg_init(in_stack_ffffffffffffff90,
                CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    local_48 = 0;
    while (iVar2 = nn_list_empty((nn_list *)((long)&pnVar3[0xb3].u + 0x10)), iVar2 == 0) {
      local_60 = nn_list_begin((nn_list *)((long)&pnVar3[0xb3].u + 0x10));
      if (local_60 == (nn_list_item *)0x0) {
        local_60 = (nn_list_item *)0x0;
      }
      pvVar5 = nn_chunkref_data((nn_chunkref *)(in_RSI + 0x40));
      it_00 = (msg_chunk *)((long)pvVar5 + local_48);
      pvVar5 = nn_chunkref_data((nn_chunkref *)(local_60 + 1));
      sVar4 = nn_chunkref_size((nn_chunkref *)it_00);
      memcpy(it_00,pvVar5,sVar4);
      sVar4 = nn_chunkref_size((nn_chunkref *)it_00);
      local_48 = sVar4 + local_48;
      nn_msg_chunk_term(it_00,(nn_list *)
                              CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    }
    if (local_48 != *(long *)((long)&pnVar3[0xb4].u + 0x10)) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","pos == sws->inmsg_total_size",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x20f);
      fflush(_stderr);
      nn_err_abort();
    }
    iVar2 = nn_list_empty((nn_list *)((long)&pnVar3[0xb3].u + 0x10));
    if (iVar2 == 0) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_list_empty (&sws->inmsg_array)",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x210);
      fflush(_stderr);
      nn_err_abort();
    }
    *(undefined4 *)((long)&pnVar3[0xb2].u + 0x10) = 0;
    nn_sws_recv_hdr((nn_sws *)0x1f1f2a);
  }
  else {
    if (iVar8 != 5) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x235);
      fflush(_stderr);
      nn_err_abort();
    }
    local_31 = pnVar3[0xb1].u.ref[4];
    if (*(int *)((long)&pnVar3[0xb2].u + 8) == 0) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sws->is_final_frame",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x220);
      fflush(_stderr);
      nn_err_abort();
    }
    if ((local_31 & 0x80) == 0) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","opcode_hdr & NN_SWS_FRAME_BITMASK_FIN",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x221);
      fflush(_stderr);
      nn_err_abort();
    }
    bVar1 = local_31 & 0xf;
    if (bVar1 != 9 && bVar1 != 10) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
              "opcode == NN_WS_OPCODE_PING || opcode == NN_WS_OPCODE_PONG",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x228);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_msg_init(in_stack_ffffffffffffff90,
                CONCAT17(bVar1 == 9 || bVar1 == 10,in_stack_ffffffffffffff88));
    pvVar5 = nn_chunkref_data((nn_chunkref *)(in_RSI + 0x40));
    memcpy(pvVar5,(void *)((long)&pnVar3[0xb4].u + 0x1d),*(size_t *)((long)&pnVar3[0xb4].u + 8));
    nn_sws_recv_hdr((nn_sws *)0x1f20ec);
  }
  local_31 = local_31 & 0x7f;
  nn_chunkref_init(pnVar9,CONCAT44(iVar8,in_stack_ffffffffffffffa8));
  puVar6 = (undefined8 *)nn_chunkref_data((nn_chunkref *)(in_RSI + 0x20));
  *(undefined4 *)(puVar6 + 1) = 0xfffffffc;
  *(undefined4 *)((long)puVar6 + 0xc) = 1;
  *puVar6 = 0x18;
  *(byte *)(puVar6 + 2) = local_31;
  return 0;
}

Assistant:

static int nn_sws_recv (struct nn_pipebase *self, struct nn_msg *msg)
{
    struct nn_sws *sws;
    struct nn_list_item *it;
    struct msg_chunk *ch;
    struct nn_cmsghdr *cmsg;
    uint8_t opcode_hdr;
    uint8_t opcode;
    size_t cmsgsz;
    size_t pos;

    sws = nn_cont (self, struct nn_sws, pipebase);

    nn_assert_state (sws, NN_SWS_STATE_ACTIVE);

    switch (sws->instate) {
    case NN_SWS_INSTATE_RECVD_CHUNKED:

        /*  Relay opcode to the user in order to interpret payload. */
        opcode_hdr = sws->inmsg_hdr;

        /*  This library should not deliver fragmented messages to the
            application, so it's expected that this is the final frame. */
        nn_assert (sws->is_final_frame);
        nn_assert (opcode_hdr & NN_SWS_FRAME_BITMASK_FIN);
        opcode_hdr &= ~NN_SWS_FRAME_BITMASK_FIN;

        /*  The library is expected to have failed any connections with other
            opcodes; these are the only two opcodes that can be chunked. */
        opcode = opcode_hdr & NN_SWS_FRAME_BITMASK_OPCODE;
        nn_assert (opcode == NN_WS_OPCODE_BINARY ||
                   opcode == NN_WS_OPCODE_TEXT);

        nn_msg_init (msg, sws->inmsg_total_size);

        pos = 0;

        /*  Reassemble incoming message scatter array. */
        while (!nn_list_empty (&sws->inmsg_array)) {
            it = nn_list_begin (&sws->inmsg_array);
            ch = nn_cont (it, struct msg_chunk, item);
            memcpy (((uint8_t*) nn_chunkref_data (&msg->body)) + pos,
                nn_chunkref_data (&ch->chunk),
                nn_chunkref_size (&ch->chunk));
            pos += nn_chunkref_size (&ch->chunk);
            nn_msg_chunk_term (ch, &sws->inmsg_array);
        }

        nn_assert (pos == sws->inmsg_total_size);
        nn_assert (nn_list_empty (&sws->inmsg_array));

        /*  No longer collecting scatter array of incoming msg chunks. */
        sws->continuing = 0;

        nn_sws_recv_hdr (sws);

        break;

    case NN_SWS_INSTATE_RECVD_CONTROL:

        /*  Relay opcode to the user in order to interpret payload. */
        opcode_hdr = sws->inhdr [0];

        /*  This library should not deliver fragmented messages to the
            application, so it's expected that this is the final frame. */
        nn_assert (sws->is_final_frame);
        nn_assert (opcode_hdr & NN_SWS_FRAME_BITMASK_FIN);
        opcode_hdr &= ~NN_SWS_FRAME_BITMASK_FIN;

        /*  The library is expected to have failed any connections with other
            opcodes; these are the only two control opcodes delivered. */
        opcode = opcode_hdr & NN_SWS_FRAME_BITMASK_OPCODE;
        nn_assert (opcode == NN_WS_OPCODE_PING ||
                   opcode == NN_WS_OPCODE_PONG);

        nn_msg_init (msg, sws->inmsg_current_chunk_len);

        memcpy (((uint8_t*) nn_chunkref_data (&msg->body)),
            sws->inmsg_control, sws->inmsg_current_chunk_len);

        nn_sws_recv_hdr (sws);

        break;

    default:
        /*  Unexpected state. */
        nn_assert (0);
        break;
    }

    /*  Allocate and populate WebSocket-specific control headers. */
    cmsgsz = NN_CMSG_SPACE (sizeof (opcode_hdr));
    nn_chunkref_init (&msg->hdrs, cmsgsz);
    cmsg = nn_chunkref_data (&msg->hdrs);
    cmsg->cmsg_level = NN_WS;
    cmsg->cmsg_type = NN_WS_MSG_TYPE;
    cmsg->cmsg_len = cmsgsz;
    memcpy (NN_CMSG_DATA (cmsg), &opcode_hdr, sizeof (opcode_hdr));

    return 0;
}